

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateUtilTest_InitStaticTemplateStringForTest::Run(void)

{
  TemplateId *this;
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__s2;
  TemplateString local_290;
  TemplateDictionaryPeer local_270;
  TemplateDictionaryPeer peer;
  size_t sStack_260;
  undefined8 local_258;
  TemplateId TStack_250;
  TemplateString local_248;
  TemplateString local_228;
  TemplateDictionary local_208 [8];
  TemplateDictionary dict;
  undefined1 local_188 [8];
  StaticTemplateString kValue;
  UnsafeArena arena;
  
  this = &kValue.do_not_use_directly_.id_;
  ctemplate::UnsafeArena::UnsafeArena((UnsafeArena *)this,0x400);
  GetTestTemplateString((StaticTemplateString *)local_188,(UnsafeArena *)this);
  ctemplate::TemplateString::TemplateString(&local_228,"test_GetSectionValue");
  ctemplate::TemplateDictionary::TemplateDictionary(local_208,&local_228,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_248,(StaticTemplateString *)local_188);
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"value");
  TVar1.length_ = local_248.length_;
  TVar1.ptr_ = local_248.ptr_;
  TVar1.is_immutable_ = local_248.is_immutable_;
  TVar1._17_7_ = local_248._17_7_;
  TVar1.id_ = local_248.id_;
  TVar2.length_ = sStack_260;
  TVar2.ptr_ = (char *)peer.dict_;
  TVar2._16_8_ = local_258;
  TVar2.id_ = TStack_250;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_270,local_208);
  ctemplate::TemplateString::TemplateString(&local_290,(StaticTemplateString *)local_188);
  __s2 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_290);
  iVar3 = strcmp("value",__s2);
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_208);
    ctemplate::UnsafeArena::~UnsafeArena((UnsafeArena *)&kValue.do_not_use_directly_.id_);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(\"value\", peer.GetSectionValue(kValue)) == 0");
  exit(1);
}

Assistant:

TEST(TemplateUtilTest, InitStaticTemplateStringForTest) {
  UnsafeArena arena(1024);
  StaticTemplateString kValue = GetTestTemplateString(&arena);

  TemplateDictionary dict("test_GetSectionValue");
  dict.SetValue(kValue, "value");

  TemplateDictionaryPeer peer(&dict);
  EXPECT_STREQ("value", peer.GetSectionValue(kValue));
}